

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O0

bool __thiscall
iqnet::Reactor<iqnet::Null_lock>::handle_system_events(Reactor<iqnet::Null_lock> *this,Timeout ms)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  int in_ECX;
  value_type local_70;
  HandlerState hs;
  undefined1 local_60 [7];
  bool succ;
  HandlerStateList ret;
  undefined1 local_38 [8];
  HandlerStateList tmp;
  scoped_lock lk;
  Timeout ms_local;
  Reactor<iqnet::Null_lock> *this_local;
  
  tmp.
  super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
  ._M_impl._M_node._M_size._4_4_ = ms;
  Null_lock::scoped_lock::scoped_lock
            ((scoped_lock *)
             ((long)&tmp.
                     super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                     ._M_impl._M_node._M_size + 3),(Null_lock *)&this->field_0x8);
  std::__cxx11::
  list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::list
            ((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
              *)local_38,&this->handlers_states);
  Null_lock::scoped_lock::unlock
            ((scoped_lock *)
             ((long)&tmp.
                     super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                     ._M_impl._M_node._M_size + 3));
  bVar1 = std::__cxx11::
          list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
          ::empty((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                   *)local_38);
  if (bVar1) {
    this_local._7_1_ = true;
    ret.
    super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
    ._M_impl._M_node._M_size._0_4_ = 1;
  }
  else {
    Reactor_poll_impl::reset(&this->impl,(HandlerStateList *)local_38);
    std::__cxx11::
    list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::
    list((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
          *)local_60);
    uVar2 = Reactor_poll_impl::poll
                      (&this->impl,(pollfd *)local_60,
                       (ulong)tmp.
                              super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                              ._M_impl._M_node._M_size._4_4_,in_ECX);
    hs.revents._1_1_ = (byte)uVar2 & 1;
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      while (bVar1 = std::__cxx11::
                     list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                     ::empty((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                              *)local_60), ((bVar1 ^ 0xffU) & 1) != 0) {
        pvVar3 = std::__cxx11::
                 list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                 ::front((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                          *)local_60);
        local_70 = *pvVar3;
        std::__cxx11::
        list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
        ::pop_front((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                     *)local_60);
        invoke_event_handler(this,&local_70);
      }
      this_local._7_1_ = true;
    }
    ret.
    super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
    ._M_impl._M_node._M_size._0_4_ = 1;
    std::__cxx11::
    list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::
    ~list((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
           *)local_60);
  }
  std::__cxx11::
  list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::~list
            ((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
              *)local_38);
  Null_lock::scoped_lock::~scoped_lock
            ((scoped_lock *)
             ((long)&tmp.
                     super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                     ._M_impl._M_node._M_size + 3));
  return this_local._7_1_;
}

Assistant:

bool Reactor<Lock>::handle_system_events(Reactor_base::Timeout ms)
{
  scoped_lock lk(lock);
  HandlerStateList tmp(handlers_states);
  lk.unlock();

  // if all events were of "user" type
  if (tmp.empty())
    return true;

  impl.reset(tmp);
  HandlerStateList ret;
  bool succ = impl.poll(ret, ms);

  if (!succ)
    return false;

  while (!ret.empty())
  {
    HandlerState hs(ret.front());
    ret.pop_front();
    invoke_event_handler(hs);
  }

  return true;
}